

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O1

void __thiscall btMatrixX<float>::copyLowerToUpperTriangle(btMatrixX<float> *this)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  int iVar4;
  long lVar5;
  float *pfVar6;
  float *pfVar7;
  long lVar8;
  
  iVar1 = this->m_rows;
  if (0 < (long)iVar1) {
    iVar2 = this->m_cols;
    pfVar3 = (this->m_storage).m_data;
    iVar4 = this->m_setElemOperations;
    lVar5 = 0;
    pfVar6 = pfVar3;
    do {
      if (lVar5 != 0) {
        iVar4 = iVar4 + (int)lVar5;
        lVar8 = 0;
        pfVar7 = pfVar3;
        do {
          *pfVar7 = pfVar6[lVar8];
          lVar8 = lVar8 + 1;
          pfVar7 = pfVar7 + iVar2;
        } while (lVar5 != lVar8);
        this->m_setElemOperations = iVar4;
      }
      lVar5 = lVar5 + 1;
      pfVar6 = pfVar6 + iVar2;
      pfVar3 = pfVar3 + 1;
    } while (lVar5 != iVar1);
  }
  return;
}

Assistant:

void copyLowerToUpperTriangle()
	{
		int count=0;
		for (int row=0;row<rows();row++)
		{
			for (int col=0;col<row;col++)
			{
				setElem(col,row, (*this)(row,col));
				count++;
				
			}
		}
		//printf("copyLowerToUpperTriangle copied %d elements out of %dx%d=%d\n", count,rows(),cols(),cols()*rows());
	}